

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_type_range
                 (lysc_ctx *ctx,lysp_restr *range_p,LY_DATA_TYPE basetype,ly_bool length_restr,
                 uint8_t frdigits,lysc_range *base_range,lysc_range **range)

{
  anon_union_8_2_6b5dfd82_for_lysc_range_part_2 *paVar1;
  char cVar2;
  ushort uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  lysp_restr *plVar7;
  int iVar8;
  LY_ERR LVar9;
  ushort **ppuVar10;
  long lVar11;
  undefined8 *puVar12;
  lysc_range *plVar13;
  uint uVar14;
  long lVar15;
  int64_t iVar16;
  char *pcVar17;
  ulong uVar18;
  lysc_range_part *plVar19;
  ulong uVar20;
  ly_ctx *ctx_00;
  ulong uVar21;
  char *pcVar22;
  char *pcVar23;
  lysc_range_part *plVar24;
  char **value;
  long local_60;
  char *local_58;
  lysc_range *local_50;
  ulong local_48;
  ulong local_40;
  lysp_restr *local_38;
  
  local_50 = base_range;
  if (range == (lysc_range **)0x0) {
    __assert_fail("range",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0x360,
                  "LY_ERR lys_compile_type_range(struct lysc_ctx *, const struct lysp_restr *, LY_DATA_TYPE, ly_bool, uint8_t, struct lysc_range *, struct lysc_range **)"
                 );
  }
  if (range_p == (lysp_restr *)0x0) {
    __assert_fail("range_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0x361,
                  "LY_ERR lys_compile_type_range(struct lysc_ctx *, const struct lysp_restr *, LY_DATA_TYPE, ly_bool, uint8_t, struct lysc_range *, struct lysc_range **)"
                 );
  }
  local_58 = (range_p->arg).str;
  bVar6 = false;
  local_38 = range_p;
  ppuVar10 = __ctype_b_loc();
  local_40 = (ulong)frdigits;
  local_48 = (ulong)length_restr;
  plVar19 = (lysc_range_part *)0x0;
  local_60 = 0;
LAB_00145a6b:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              plVar7 = local_38;
              pcVar23 = local_58;
              cVar2 = *local_58;
              uVar3 = (*ppuVar10)[cVar2];
              if ((uVar3 >> 0xd & 1) == 0) break;
              local_58 = local_58 + 1;
            }
            if (cVar2 == '\0') {
              if (bVar6) {
                ctx_00 = ctx->ctx;
                pcVar22 = "length";
                if (length_restr == '\0') {
                  pcVar22 = "range";
                }
                pcVar23 = (local_38->arg).str;
                pcVar17 = 
                "Invalid %s restriction - unexpected end of the expression after \"..\" (%s).";
                goto LAB_001460bc;
              }
              if ((plVar19 == (lysc_range_part *)0x0) || (local_60 == plVar19[-1].field_1.max_64)) {
                ctx_00 = ctx->ctx;
                pcVar22 = "length";
                if (length_restr == '\0') {
                  pcVar22 = "range";
                }
                pcVar23 = (local_38->arg).str;
                pcVar17 = "Invalid %s restriction - unexpected end of the expression (%s).";
                goto LAB_001460bc;
              }
              if (local_50 == (lysc_range *)0x0) goto LAB_001462f1;
              uVar14 = basetype - LY_TYPE_BINARY;
              if ((uVar14 < 0x13) && ((0x7813fU >> (uVar14 & 0x1f) & 1) != 0)) {
                uVar14 = 0x78100 >> ((byte)uVar14 & 0x1f);
                if (local_60 != -1) {
                  plVar24 = local_50->parts;
                  uVar20 = 0;
                  uVar18 = 0;
                  goto LAB_0014615c;
                }
                uVar18 = 0;
                goto LAB_001462e8;
              }
              LVar9 = LY_EINT;
              ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                     ,0x3da);
              goto LAB_001463f5;
            }
            iVar8 = strncmp(local_58,"min",3);
            if (iVar8 != 0) break;
            if (plVar19 != (lysc_range_part *)0x0) {
              pcVar22 = "length";
              if (length_restr == '\0') {
                pcVar22 = "range";
              }
              pcVar17 = (local_38->arg).str;
              ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid %s restriction - unexpected data before min keyword (%.*s).",pcVar22,
                      (ulong)(uint)((int)pcVar23 - (int)pcVar17),pcVar17);
              goto LAB_001460c3;
            }
            local_58 = pcVar23 + 3;
            puVar12 = (undefined8 *)malloc(0x18);
            if (puVar12 == (undefined8 *)0x0) {
              ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_compile_type_range");
              plVar19 = (lysc_range_part *)0x0;
            }
            else {
              *puVar12 = 1;
              plVar19 = (lysc_range_part *)(puVar12 + 1);
            }
            LVar9 = (LY_ERR)(puVar12 == (undefined8 *)0x0);
            if (puVar12 == (undefined8 *)0x0) goto LAB_001463f5;
            lVar11 = plVar19[-1].field_1.max_64;
            plVar24 = plVar19 + lVar11 + -1;
            (plVar24->field_0).min_64 = 0;
            plVar19[lVar11 + -1].field_1.max_64 = 0;
            LVar9 = range_part_minmax(ctx,plVar24,'\0',0,basetype,'\x01',(ly_bool)local_48,
                                      (uint8_t)local_40,local_50,(char **)0x0);
            if (LVar9 != LY_SUCCESS) goto LAB_001463f5;
            plVar19[lVar11 + -1].field_1 =
                 *(anon_union_8_2_6b5dfd82_for_lysc_range_part_2 *)&plVar24->field_0;
          }
          if (cVar2 != '|') break;
          if ((plVar19 == (lysc_range_part *)0x0) || (bVar6)) {
            ctx_00 = ctx->ctx;
            pcVar22 = "length";
            if (length_restr == '\0') {
              pcVar22 = "range";
            }
            pcVar17 = "Invalid %s restriction - unexpected beginning of the expression (%s).";
            goto LAB_001460bc;
          }
          local_58 = pcVar23 + 1;
          local_60 = local_60 + 1;
        }
        iVar8 = strncmp(pcVar23,"..",2);
        if (iVar8 != 0) break;
        pcVar23 = pcVar23 + 2;
        do {
          local_58 = pcVar23;
          pcVar23 = local_58 + 1;
        } while ((*(byte *)((long)*ppuVar10 + (long)*local_58 * 2 + 1) & 0x20) != 0);
        if ((plVar19 == (lysc_range_part *)0x0) ||
           (bVar6 = true, plVar19[-1].field_1.max_64 == local_60)) {
          pcVar23 = "length";
          if (length_restr == '\0') {
            pcVar23 = "range";
          }
          ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid %s restriction - unexpected \"..\" without a lower bound.",pcVar23);
          goto LAB_001460c3;
        }
      }
      if ((((uVar3 >> 0xb & 1) != 0) || (cVar2 == '-')) || (cVar2 == '+')) break;
      iVar8 = strncmp(pcVar23,"max",3);
      if (iVar8 != 0) {
        ctx_00 = ctx->ctx;
        pcVar22 = "length";
        if (length_restr == '\0') {
          pcVar22 = "range";
        }
        pcVar17 = "Invalid %s restriction - unexpected data (%s).";
        goto LAB_001460bc;
      }
      pcVar22 = pcVar23 + 3;
      do {
        pcVar23 = pcVar22;
        pcVar22 = pcVar23 + 1;
      } while ((*(byte *)((long)*ppuVar10 + (long)*pcVar23 * 2 + 1) & 0x20) != 0);
      local_58 = pcVar23;
      if (*pcVar23 != '\0') {
        ctx_00 = ctx->ctx;
        pcVar22 = "length";
        if (length_restr == '\0') {
          pcVar22 = "range";
        }
        pcVar17 = "Invalid %s restriction - unexpected data after max keyword (%s).";
        goto LAB_001460bc;
      }
      if (bVar6) {
        if (plVar19 == (lysc_range_part *)0x0) {
          lVar11 = -1;
        }
        else {
          lVar11 = plVar19[-1].field_1.max_64 + -1;
        }
        iVar16 = plVar19[lVar11].field_0.min_64;
        value = (char **)0x0;
        plVar13 = local_50;
        goto LAB_00145cc0;
      }
      if (plVar19 == (lysc_range_part *)0x0) {
        puVar12 = (undefined8 *)malloc(0x18);
        if (puVar12 != (undefined8 *)0x0) {
          *puVar12 = 1;
          goto LAB_00145ee2;
        }
        plVar19 = (lysc_range_part *)0x0;
        LVar9 = LY_EMEM;
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_range"
              );
        bVar6 = false;
      }
      else {
        paVar1 = &plVar19[-1].field_1;
        lVar11 = plVar19[-1].field_1.max_64 + 1;
        plVar19[-1].field_1.max_64 = lVar11;
        puVar12 = (undefined8 *)realloc(paVar1,lVar11 * 0x10 | 8);
        if (puVar12 == (undefined8 *)0x0) {
          paVar1->max_64 = paVar1->max_64 + -1;
          bVar6 = false;
          LVar9 = LY_EMEM;
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_type_range");
        }
        else {
LAB_00145ee2:
          plVar19 = (lysc_range_part *)(puVar12 + 1);
          bVar6 = true;
          LVar9 = LY_SUCCESS;
        }
      }
      if (!bVar6) goto LAB_001463f5;
      lVar11 = plVar19[-1].field_1.max_64;
      plVar19[lVar11 + -1].field_0.min_64 = 0;
      plVar19[lVar11 + -1].field_1.max_64 = 0;
      if (local_60 == 0) {
        iVar16 = 0;
      }
      else {
        if (plVar19 == (lysc_range_part *)0x0) {
          lVar15 = -2;
        }
        else {
          lVar15 = plVar19[-1].field_1.max_64 + -2;
        }
        iVar16 = plVar19[lVar15].field_1.max_64;
      }
      LVar9 = range_part_minmax(ctx,plVar19 + lVar11 + -1,'\x01',iVar16,basetype,local_60 == 0,
                                (ly_bool)local_48,(uint8_t)local_40,local_50,(char **)0x0);
      if (LVar9 != LY_SUCCESS) goto LAB_001463f5;
      plVar19[lVar11 + -1].field_0 =
           (anon_union_8_2_8591b15e_for_lysc_range_part_0)plVar19[lVar11 + -1].field_1;
      bVar6 = false;
    }
    if (!bVar6) {
      if (plVar19 == (lysc_range_part *)0x0) {
        puVar12 = (undefined8 *)malloc(0x18);
        if (puVar12 != (undefined8 *)0x0) {
          *puVar12 = 1;
          goto LAB_00145d56;
        }
        plVar19 = (lysc_range_part *)0x0;
        LVar9 = LY_EMEM;
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_range"
              );
        bVar6 = false;
      }
      else {
        paVar1 = &plVar19[-1].field_1;
        lVar11 = plVar19[-1].field_1.max_64 + 1;
        plVar19[-1].field_1.max_64 = lVar11;
        puVar12 = (undefined8 *)realloc(paVar1,lVar11 * 0x10 | 8);
        if (puVar12 == (undefined8 *)0x0) {
          paVar1->max_64 = paVar1->max_64 + -1;
          bVar6 = false;
          LVar9 = LY_EMEM;
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_type_range");
        }
        else {
LAB_00145d56:
          plVar19 = (lysc_range_part *)(puVar12 + 1);
          bVar6 = true;
          LVar9 = LY_SUCCESS;
        }
      }
      if (!bVar6) break;
      lVar11 = plVar19[-1].field_1.max_64;
      plVar19[lVar11 + -1].field_0.min_64 = 0;
      plVar19[lVar11 + -1].field_1.max_64 = 0;
      if (local_60 == 0) {
        iVar16 = 0;
      }
      else {
        if (plVar19 == (lysc_range_part *)0x0) {
          lVar15 = -2;
        }
        else {
          lVar15 = plVar19[-1].field_1.max_64 + -2;
        }
        iVar16 = plVar19[lVar15].field_1.max_64;
      }
      LVar9 = range_part_minmax(ctx,plVar19 + lVar11 + -1,'\0',iVar16,basetype,local_60 == 0,
                                (ly_bool)local_48,(uint8_t)local_40,(lysc_range *)0x0,&local_58);
      if (LVar9 != LY_SUCCESS) break;
      plVar19[lVar11 + -1].field_1 =
           *(anon_union_8_2_6b5dfd82_for_lysc_range_part_2 *)&plVar19[lVar11 + -1].field_0;
      bVar6 = false;
      goto LAB_00145a6b;
    }
    if (plVar19 == (lysc_range_part *)0x0) {
      lVar11 = -1;
    }
    else {
      lVar11 = plVar19[-1].field_1.max_64 + -1;
    }
    iVar16 = plVar19[lVar11].field_0.min_64;
    value = &local_58;
    plVar13 = (lysc_range *)0x0;
LAB_00145cc0:
    bVar6 = false;
    LVar9 = range_part_minmax(ctx,plVar19 + lVar11,'\x01',iVar16,basetype,'\0',(ly_bool)local_48,
                              (uint8_t)local_40,plVar13,value);
  } while (LVar9 == LY_SUCCESS);
  goto LAB_001463f5;
LAB_0014615c:
  do {
    if (plVar24 == (lysc_range_part *)0x0) {
      uVar21 = 0;
    }
    else {
      uVar21 = plVar24[-1].field_1.max_u64;
    }
    if (uVar21 <= uVar20) break;
    if ((uVar14 & 1) == 0) {
      if (plVar19[uVar18].field_0.min_u64 < plVar24[uVar20].field_0.min_u64) goto LAB_00146418;
      if ((uVar14 & 1) != 0) goto LAB_00146196;
    }
    else {
LAB_00146196:
      if (plVar19[uVar18].field_0.min_64 < plVar24[uVar20].field_0.min_64) goto LAB_00146418;
    }
    uVar21 = plVar24[uVar20].field_1.max_u64;
    uVar4 = plVar19[uVar18].field_0.min_u64;
    if (plVar24[uVar20].field_0.min_64 == uVar21) {
      if (plVar24[uVar20].field_0.min_64 != uVar4) {
LAB_0014620a:
        uVar20 = uVar20 + 1;
        uVar18 = uVar18 - 1;
        goto LAB_00146247;
      }
      if (uVar4 != plVar19[uVar18].field_1.max_64) goto LAB_00146418;
LAB_00146244:
      uVar20 = uVar20 + 1;
    }
    else {
      uVar5 = plVar19[uVar18].field_1.max_64;
      if (uVar4 == uVar5) {
        if ((uVar21 < uVar5 && (uVar14 & 1) == 0) ||
           (((uVar14 & 1) != 0 && (plVar24[uVar20].field_1.max_64 < (long)uVar5))))
        goto LAB_0014620a;
      }
      else if ((uVar21 < uVar5 && (uVar14 & 1) == 0) ||
              (((uVar14 & 1) != 0 && (plVar24[uVar20].field_1.max_64 < (long)uVar5)))) {
        if ((uVar14 & 1) == 0) {
          if (uVar4 <= plVar24[uVar20].field_1.max_u64) {
            if ((uVar14 & 1) != 0) goto LAB_00146236;
            goto LAB_00146418;
          }
        }
        else {
LAB_00146236:
          if ((long)uVar4 <= plVar24[uVar20].field_1.max_64) goto LAB_00146418;
        }
        uVar18 = uVar18 - 1;
        goto LAB_00146244;
      }
    }
LAB_00146247:
    uVar18 = uVar18 + 1;
  } while (uVar18 < local_60 + 1U);
LAB_001462e8:
  if (uVar18 == local_60 + 1U) {
LAB_001462f1:
    if (*range == (lysc_range *)0x0) {
      plVar13 = (lysc_range *)calloc(1,0x30);
      *range = plVar13;
      if (plVar13 == (lysc_range *)0x0) {
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_range"
              );
        return LY_EMEM;
      }
    }
    if (plVar7->eapptag != (char *)0x0) {
      lydict_remove(ctx->ctx,(*range)->eapptag);
      LVar9 = lydict_insert(ctx->ctx,plVar7->eapptag,0,&(*range)->eapptag);
      if (LVar9 != LY_SUCCESS) goto LAB_001463f5;
    }
    if (plVar7->emsg != (char *)0x0) {
      lydict_remove(ctx->ctx,(*range)->emsg);
      LVar9 = lydict_insert(ctx->ctx,plVar7->emsg,0,&(*range)->emsg);
      if (LVar9 != LY_SUCCESS) goto LAB_001463f5;
    }
    if (plVar7->dsc != (char *)0x0) {
      lydict_remove(ctx->ctx,(*range)->dsc);
      LVar9 = lydict_insert(ctx->ctx,plVar7->dsc,0,&(*range)->dsc);
      if (LVar9 != LY_SUCCESS) goto LAB_001463f5;
    }
    if (plVar7->ref != (char *)0x0) {
      lydict_remove(ctx->ctx,(*range)->ref);
      LVar9 = lydict_insert(ctx->ctx,plVar7->ref,0,&(*range)->ref);
      if (LVar9 != LY_SUCCESS) goto LAB_001463f5;
    }
    (*range)->parts = plVar19;
    LVar9 = LY_SUCCESS;
    plVar19 = (lysc_range_part *)0x0;
  }
  else {
LAB_00146418:
    ctx_00 = ctx->ctx;
    pcVar22 = "length";
    if (length_restr == '\0') {
      pcVar22 = "range";
    }
    pcVar23 = (local_38->arg).str;
    pcVar17 = 
    "Invalid %s restriction - the derived restriction (%s) is not equally or more limiting.";
LAB_001460bc:
    ly_vlog(ctx_00,(char *)0x0,LYVE_SYNTAX_YANG,pcVar17,pcVar22,pcVar23);
LAB_001460c3:
    LVar9 = LY_EVALID;
  }
LAB_001463f5:
  if (plVar19 != (lysc_range_part *)0x0) {
    free(&plVar19[-1].field_1);
  }
  return LVar9;
}

Assistant:

LY_ERR
lys_compile_type_range(struct lysc_ctx *ctx, const struct lysp_restr *range_p, LY_DATA_TYPE basetype, ly_bool length_restr,
        uint8_t frdigits, struct lysc_range *base_range, struct lysc_range **range)
{
    LY_ERR ret = LY_SUCCESS;
    const char *expr;
    struct lysc_range_part *parts = NULL, *part;
    ly_bool range_expected = 0, uns;
    LY_ARRAY_COUNT_TYPE parts_done = 0, u, v;

    assert(range);
    assert(range_p);

    expr = range_p->arg.str;
    while (1) {
        if (isspace(*expr)) {
            ++expr;
        } else if (*expr == '\0') {
            if (range_expected) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected end of the expression after \"..\" (%s).",
                        length_restr ? "length" : "range", range_p->arg.str);
                ret = LY_EVALID;
                goto cleanup;
            } else if (!parts || (parts_done == LY_ARRAY_COUNT(parts))) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected end of the expression (%s).",
                        length_restr ? "length" : "range", range_p->arg.str);
                ret = LY_EVALID;
                goto cleanup;
            }
            parts_done++;
            break;
        } else if (!strncmp(expr, "min", ly_strlen_const("min"))) {
            if (parts) {
                /* min cannot be used elsewhere than in the first part */
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected data before min keyword (%.*s).", length_restr ? "length" : "range",
                        (int)(expr - range_p->arg.str), range_p->arg.str);
                ret = LY_EVALID;
                goto cleanup;
            }
            expr += ly_strlen_const("min");

            LY_ARRAY_NEW_GOTO(ctx->ctx, parts, part, ret, cleanup);
            LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 0, 0, basetype, 1, length_restr, frdigits, base_range, NULL), cleanup);
            part->max_64 = part->min_64;
        } else if (*expr == '|') {
            if (!parts || range_expected) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected beginning of the expression (%s).", length_restr ? "length" : "range", expr);
                ret = LY_EVALID;
                goto cleanup;
            }
            expr++;
            parts_done++;
            /* process next part of the expression */
        } else if (!strncmp(expr, "..", 2)) {
            expr += 2;
            while (isspace(*expr)) {
                expr++;
            }
            if (!parts || (LY_ARRAY_COUNT(parts) == parts_done)) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected \"..\" without a lower bound.", length_restr ? "length" : "range");
                ret = LY_EVALID;
                goto cleanup;
            }
            /* continue expecting the upper boundary */
            range_expected = 1;
        } else if (isdigit(*expr) || (*expr == '-') || (*expr == '+')) {
            /* number */
            if (range_expected) {
                part = &parts[LY_ARRAY_COUNT(parts) - 1];
                LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 1, part->min_64, basetype, 0, length_restr, frdigits, NULL, &expr), cleanup);
                range_expected = 0;
            } else {
                LY_ARRAY_NEW_GOTO(ctx->ctx, parts, part, ret, cleanup);
                LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 0, parts_done ? parts[LY_ARRAY_COUNT(parts) - 2].max_64 : 0,
                        basetype, parts_done ? 0 : 1, length_restr, frdigits, NULL, &expr), cleanup);
                part->max_64 = part->min_64;
            }

            /* continue with possible another expression part */
        } else if (!strncmp(expr, "max", ly_strlen_const("max"))) {
            expr += ly_strlen_const("max");
            while (isspace(*expr)) {
                expr++;
            }
            if (*expr != '\0') {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG, "Invalid %s restriction - unexpected data after max keyword (%s).",
                        length_restr ? "length" : "range", expr);
                ret = LY_EVALID;
                goto cleanup;
            }
            if (range_expected) {
                part = &parts[LY_ARRAY_COUNT(parts) - 1];
                LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 1, part->min_64, basetype, 0, length_restr, frdigits, base_range, NULL), cleanup);
                range_expected = 0;
            } else {
                LY_ARRAY_NEW_GOTO(ctx->ctx, parts, part, ret, cleanup);
                LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 1, parts_done ? parts[LY_ARRAY_COUNT(parts) - 2].max_64 : 0,
                        basetype, parts_done ? 0 : 1, length_restr, frdigits, base_range, NULL), cleanup);
                part->min_64 = part->max_64;
            }
        } else {
            LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG, "Invalid %s restriction - unexpected data (%s).",
                    length_restr ? "length" : "range", expr);
            ret = LY_EVALID;
            goto cleanup;
        }
    }

    /* check with the previous range/length restriction */
    if (base_range) {
        switch (basetype) {
        case LY_TYPE_BINARY:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
        case LY_TYPE_STRING:
            uns = 1;
            break;
        case LY_TYPE_DEC64:
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
            uns = 0;
            break;
        default:
            LOGINT(ctx->ctx);
            ret = LY_EINT;
            goto cleanup;
        }
        for (u = v = 0; u < parts_done && v < LY_ARRAY_COUNT(base_range->parts); ++u) {
            if ((uns && (parts[u].min_u64 < base_range->parts[v].min_u64)) || (!uns && (parts[u].min_64 < base_range->parts[v].min_64))) {
                goto baseerror;
            }
            /* current lower bound is not lower than the base */
            if (base_range->parts[v].min_64 == base_range->parts[v].max_64) {
                /* base has single value */
                if (base_range->parts[v].min_64 == parts[u].min_64) {
                    /* both lower bounds are the same */
                    if (parts[u].min_64 != parts[u].max_64) {
                        /* current continues with a range */
                        goto baseerror;
                    } else {
                        /* equal single values, move both forward */
                        ++v;
                        continue;
                    }
                } else {
                    /* base is single value lower than current range, so the
                     * value from base range is removed in the current,
                     * move only base and repeat checking */
                    ++v;
                    --u;
                    continue;
                }
            } else {
                /* base is the range */
                if (parts[u].min_64 == parts[u].max_64) {
                    /* current is a single value */
                    if ((uns && (parts[u].max_u64 > base_range->parts[v].max_u64)) || (!uns && (parts[u].max_64 > base_range->parts[v].max_64))) {
                        /* current is behind the base range, so base range is omitted,
                         * move the base and keep the current for further check */
                        ++v;
                        --u;
                    } /* else it is within the base range, so move the current, but keep the base */
                    continue;
                } else {
                    /* both are ranges - check the higher bound, the lower was already checked */
                    if ((uns && (parts[u].max_u64 > base_range->parts[v].max_u64)) || (!uns && (parts[u].max_64 > base_range->parts[v].max_64))) {
                        /* higher bound is higher than the current higher bound */
                        if ((uns && (parts[u].min_u64 > base_range->parts[v].max_u64)) || (!uns && (parts[u].min_64 > base_range->parts[v].max_64))) {
                            /* but the current lower bound is also higher, so the base range is omitted,
                             * continue with the same current, but move the base */
                            --u;
                            ++v;
                            continue;
                        }
                        /* current range starts within the base range but end behind it */
                        goto baseerror;
                    } else {
                        /* current range is smaller than the base,
                         * move current, but stay with the base */
                        continue;
                    }
                }
            }
        }
        if (u != parts_done) {
baseerror:
            LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                    "Invalid %s restriction - the derived restriction (%s) is not equally or more limiting.",
                    length_restr ? "length" : "range", range_p->arg.str);
            ret = LY_EVALID;
            goto cleanup;
        }
    }

    if (!(*range)) {
        *range = calloc(1, sizeof **range);
        LY_CHECK_ERR_RET(!(*range), LOGMEM(ctx->ctx), LY_EMEM);
    }

    /* we rewrite the following values as the types chain is being processed */
    if (range_p->eapptag) {
        lydict_remove(ctx->ctx, (*range)->eapptag);
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, range_p->eapptag, 0, &(*range)->eapptag), cleanup);
    }
    if (range_p->emsg) {
        lydict_remove(ctx->ctx, (*range)->emsg);
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, range_p->emsg, 0, &(*range)->emsg), cleanup);
    }
    if (range_p->dsc) {
        lydict_remove(ctx->ctx, (*range)->dsc);
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, range_p->dsc, 0, &(*range)->dsc), cleanup);
    }
    if (range_p->ref) {
        lydict_remove(ctx->ctx, (*range)->ref);
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, range_p->ref, 0, &(*range)->ref), cleanup);
    }
    /* extensions are taken only from the last range by the caller */

    (*range)->parts = parts;
    parts = NULL;
cleanup:
    LY_ARRAY_FREE(parts);

    return ret;
}